

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::TemplateNode::render
          (TemplateNode *this,ostringstream *out,shared_ptr<minja::Context> *context)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  ostringstream err_1;
  LoopControlException *e;
  ostringstream err;
  exception *e_1;
  
  (**(code **)*in_RDI)(in_RDI,in_RSI,in_RDX);
  return;
}

Assistant:

void render(std::ostringstream & out, const std::shared_ptr<Context> & context) const {
        try {
            do_render(out, context);
        } catch (const LoopControlException & e) {
            // TODO: make stack creation lazy. Only needed if it was thrown outside of a loop.
            std::ostringstream err;
            err << e.what();
            if (location_.source) err << error_location_suffix(*location_.source, location_.pos);
            throw LoopControlException(err.str(), e.control_type);
        } catch (const std::exception & e) {
            std::ostringstream err;
            err << e.what();
            if (location_.source) err << error_location_suffix(*location_.source, location_.pos);
            throw std::runtime_error(err.str());
        }
    }